

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
::~table_core(table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
              *this)

{
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
  ::
  for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>::~for_all_elements()::_lambda(std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>*)_1_>
            (&this->arrays,(anon_class_8_1_8991fb9c)this);
  delete_arrays(this,&this->arrays);
  return;
}

Assistant:

~table_core() noexcept {
        for_all_elements([this](element_type* p) { destroy_element(p); });
        delete_arrays(arrays);
    }